

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int quantize_segment_mix(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 *puVar4;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  uint32_t size;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  uint32_t samples;
  float *out;
  float *in;
  uint32_t local_44;
  float *local_40;
  float *local_38;
  
  puVar4 = (undefined8 *)segment->data;
  fVar1 = *(float *)(puVar4 + 2);
  fVar2 = *(float *)((long)puVar4 + 0x14);
  local_44 = 0xffffffff;
  buffer = (mixed_buffer *)*puVar4;
  buffer_00 = (mixed_buffer *)puVar4[1];
  mixed_buffer_request_read(&local_38,&local_44,buffer);
  if (buffer == buffer_00) {
    local_40 = local_38;
    uVar6 = (ulong)local_44;
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        fVar3 = local_38[uVar5];
        fVar7 = floorf(fVar1 * fVar3);
        local_38[uVar5] = fVar3 * (1.0 - fVar2) + (fVar7 / fVar1) * fVar2;
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
  }
  else {
    mixed_buffer_request_write(&local_40,&local_44,buffer_00);
    size = local_44;
    uVar6 = (ulong)local_44;
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        fVar3 = local_38[uVar5];
        fVar7 = floorf(fVar1 * fVar3);
        local_40[uVar5] = fVar3 * (1.0 - fVar2) + (fVar7 / fVar1) * fVar2;
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    mixed_buffer_finish_read(size,buffer);
    mixed_buffer_finish_write(local_44,buffer_00);
  }
  return 1;
}

Assistant:

VECTORIZE int quantize_segment_mix(struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;

  float steps = data->steps;
  float mix = data->mix;
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float s = in[i];
      float o = floor(s * steps) / steps;
      out[i] = LERP(s, o, mix);
    });
  return 1;
}